

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportInstallFileGenerator::GenerateMainFile(cmExportInstallFileGenerator *this,ostream *os)

{
  TargetType TVar1;
  cmMakefile *this_00;
  cmTarget *target;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  PolicyStatus PVar5;
  cmExportSet *pcVar6;
  char *pcVar7;
  ostream *poVar8;
  pointer ppcVar9;
  byte bVar10;
  char *versionString;
  bool bVar11;
  string *in_name;
  pointer config;
  pair<std::_Rb_tree_iterator<cmTarget_*>,_bool> pVar12;
  string sep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  cmTargetExport *te;
  string installPrefix;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> allTargets;
  ostringstream e;
  undefined4 local_1a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined4 *local_188;
  undefined8 local_180;
  
  allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  installPrefix._M_dataplus._M_p = (pointer)&installPrefix.field_2;
  installPrefix._M_string_length = 0;
  allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  installPrefix.field_2._M_local_buf[0] = '\0';
  sep._M_dataplus._M_p = (pointer)&sep.field_2;
  sep._M_string_length = 0;
  sep.field_2._M_local_buf[0] = '\0';
  pcVar6 = this->IEGen->ExportSet;
  for (ppcVar9 = (pcVar6->TargetExports).
                 super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppcVar9 !=
      (pcVar6->TargetExports).
      super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar9 = ppcVar9 + 1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &missingTargets,&sep,&(this->super_cmExportFileGenerator).Namespace);
    cmTarget::GetExportName_abi_cxx11_((string *)&te,(*ppcVar9)->Target);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &missingTargets,(string *)&te);
    std::__cxx11::string::append((string *)&installPrefix);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&te);
    std::__cxx11::string::~string((string *)&missingTargets);
    std::__cxx11::string::assign((char *)&sep);
    te = *ppcVar9;
    pVar12 = std::
             _Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
             ::_M_insert_unique<cmTarget*const&>
                       ((_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                         *)&(this->super_cmExportFileGenerator).ExportedTargets,&te->Target);
    if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar8 = std::operator<<((ostream *)&e,"install(EXPORT \"");
      poVar8 = std::operator<<(poVar8,(string *)&this->IEGen->ExportSet->Name);
      poVar8 = std::operator<<(poVar8,"\" ...) ");
      poVar8 = std::operator<<(poVar8,"includes target \"");
      poVar8 = std::operator<<(poVar8,(string *)&te->Target->Name);
      std::operator<<(poVar8,"\" more than once in the export set.");
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error
                ((char *)missingTargets.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,(char *)0x0,(char *)0x0,
                 (char *)0x0);
      std::__cxx11::string::~string((string *)&missingTargets);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      std::__cxx11::string::~string((string *)&sep);
      std::__cxx11::string::~string((string *)&installPrefix);
      bVar11 = false;
      goto LAB_00457ad3;
    }
    std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::push_back
              (&allTargets,(value_type *)&te);
    pcVar6 = this->IEGen->ExportSet;
  }
  cmExportFileGenerator::GenerateExpectedTargetsCode
            (&this->super_cmExportFileGenerator,os,&installPrefix);
  std::__cxx11::string::~string((string *)&sep);
  std::__cxx11::string::~string((string *)&installPrefix);
  this_00 = this->IEGen->Makefile;
  std::__cxx11::string::string((string *)&e,"CMAKE_INSTALL_PREFIX",(allocator *)&sep);
  pcVar7 = cmMakefile::GetSafeDefinition(this_00,(string *)&e);
  std::__cxx11::string::string((string *)&installPrefix,pcVar7,(allocator *)&missingTargets);
  std::__cxx11::string::~string((string *)&e);
  in_name = &(this->IEGen->super_cmInstallGenerator).Destination;
  bVar3 = cmsys::SystemTools::FileIsFullPath(in_name);
  if (bVar3) {
    poVar8 = std::operator<<(os,
                             "# The installation prefix configured by this project.\nset(_IMPORT_PREFIX \""
                            );
    poVar8 = std::operator<<(poVar8,(string *)&installPrefix);
    std::operator<<(poVar8,"\")\n\n");
    goto LAB_00457642;
  }
  std::operator+(&sep,&installPrefix,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,&sep,
                 in_name);
  std::__cxx11::string::~string((string *)&sep);
  std::operator+(&sep,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,"/");
  poVar8 = std::operator<<(os,"# Compute the installation prefix relative to this file.\n");
  poVar8 = std::operator<<(poVar8,"get_filename_component(_IMPORT_PREFIX");
  std::operator<<(poVar8," \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n");
  bVar3 = cmHasLiteralPrefix<char_const*,6ul>(sep._M_dataplus._M_p,(char (*) [6])0x553f8e);
  if (bVar3) {
LAB_0045756e:
    poVar8 = std::operator<<(os,
                             "# Use original install prefix when loaded through a\n# cross-prefix symbolic link such as /lib -> /usr/lib.\nget_filename_component(_realCurr \"${_IMPORT_PREFIX}\" REALPATH)\nget_filename_component(_realOrig \""
                            );
    poVar8 = std::operator<<(poVar8,(string *)&e);
    poVar8 = std::operator<<(poVar8,
                             "\" REALPATH)\nif(_realCurr STREQUAL _realOrig)\n  set(_IMPORT_PREFIX \""
                            );
    poVar8 = std::operator<<(poVar8,(string *)&e);
    std::operator<<(poVar8,"\")\nendif()\nunset(_realOrig)\nunset(_realCurr)\n");
  }
  else {
    bVar3 = cmHasLiteralPrefix<char_const*,8ul>(sep._M_dataplus._M_p,(char (*) [8])0x553f98);
    if (bVar3) goto LAB_0045756e;
    bVar3 = cmHasLiteralPrefix<char_const*,10ul>(sep._M_dataplus._M_p,(char (*) [10])"/usr/lib/");
    if (bVar3) goto LAB_0045756e;
    bVar3 = cmHasLiteralPrefix<char_const*,12ul>(sep._M_dataplus._M_p,(char (*) [12])"/usr/lib64/");
    if (bVar3) goto LAB_0045756e;
  }
  std::__cxx11::string::string((string *)&missingTargets,(string *)in_name);
  while (missingTargets.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::operator<<(os,"get_filename_component(_IMPORT_PREFIX \"${_IMPORT_PREFIX}\" PATH)\n");
    cmsys::SystemTools::GetFilenamePath((string *)&te,(string *)&missingTargets);
    std::__cxx11::string::operator=((string *)&missingTargets,(string *)&te);
    std::__cxx11::string::~string((string *)&te);
  }
  std::operator<<(os,"\n");
  std::__cxx11::string::~string((string *)&missingTargets);
  std::__cxx11::string::~string((string *)&sep);
  std::__cxx11::string::~string((string *)&e);
LAB_00457642:
  missingTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  missingTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  missingTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar10 = 0;
  bVar11 = false;
  bVar2 = false;
  bVar3 = false;
  for (ppcVar9 = allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppcVar9 !=
      allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar9 = ppcVar9 + 1) {
    target = (*ppcVar9)->Target;
    bVar4 = !bVar3;
    bVar3 = true;
    if (bVar4) {
      bVar3 = target->TargetTypeValue != INTERFACE_LIBRARY;
    }
    cmExportFileGenerator::GenerateImportTargetCode(&this->super_cmExportFileGenerator,os,target);
    local_1a0[0] = 0;
    local_198._M_allocated_capacity = 0;
    local_198._8_8_ = local_1a0;
    local_180 = 0;
    local_188 = (undefined4 *)local_198._8_8_;
    cmExportFileGenerator::PopulateIncludeDirectoriesInterface
              (&this->super_cmExportFileGenerator,*ppcVar9,InstallInterface,(ImportPropertyMap *)&e,
               &missingTargets);
    cmExportFileGenerator::PopulateSourcesInterface
              (&this->super_cmExportFileGenerator,*ppcVar9,InstallInterface,(ImportPropertyMap *)&e,
               &missingTargets);
    std::__cxx11::string::string
              ((string *)&sep,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",(allocator *)&te);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&sep,target,InstallInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::~string((string *)&sep);
    std::__cxx11::string::string((string *)&sep,"INTERFACE_COMPILE_DEFINITIONS",(allocator *)&te);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&sep,target,InstallInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::~string((string *)&sep);
    std::__cxx11::string::string((string *)&sep,"INTERFACE_COMPILE_OPTIONS",(allocator *)&te);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&sep,target,InstallInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::~string((string *)&sep);
    std::__cxx11::string::string((string *)&sep,"INTERFACE_AUTOUIC_OPTIONS",(allocator *)&te);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&sep,target,InstallInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::~string((string *)&sep);
    std::__cxx11::string::string((string *)&sep,"INTERFACE_COMPILE_FEATURES",(allocator *)&te);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&sep,target,InstallInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::~string((string *)&sep);
    PVar5 = cmTarget::GetPolicyStatusCMP0022(target);
    if (PVar5 != WARN) {
      PVar5 = cmTarget::GetPolicyStatusCMP0022(target);
      if (PVar5 != OLD) {
        bVar4 = cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                          (&this->super_cmExportFileGenerator,target,InstallInterface,
                           (ImportPropertyMap *)&e,&missingTargets);
        if (bVar4) {
          bVar10 = bVar10 | (this->super_cmExportFileGenerator).ExportOld ^ 1U;
        }
      }
    }
    TVar1 = target->TargetTypeValue;
    std::__cxx11::string::string((string *)&sep,"INTERFACE_SOURCES",(allocator *)&te);
    pcVar7 = cmTarget::GetProperty(target,&sep);
    std::__cxx11::string::~string((string *)&sep);
    std::__cxx11::string::string
              ((string *)&sep,"INTERFACE_POSITION_INDEPENDENT_CODE",(allocator *)&te);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&sep,target,(ImportPropertyMap *)&e);
    std::__cxx11::string::~string((string *)&sep);
    cmExportFileGenerator::PopulateCompatibleInterfaceProperties
              (&this->super_cmExportFileGenerator,target,(ImportPropertyMap *)&e);
    cmExportFileGenerator::GenerateInterfaceProperties
              (&this->super_cmExportFileGenerator,target,os,(ImportPropertyMap *)&e);
    bVar11 = (bool)(bVar11 | TVar1 == INTERFACE_LIBRARY);
    bVar2 = (bool)(bVar2 | pcVar7 != (char *)0x0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&e);
  }
  if ((bVar2 || bVar11) || (bVar10 & 1) != 0) {
    pcVar7 = "2.8.12";
    if (bVar11) {
      pcVar7 = "3.0.0";
    }
    versionString = "3.1.0";
    if (!bVar2) {
      versionString = pcVar7;
    }
    cmExportFileGenerator::GenerateRequiredCMakeVersion
              (&this->super_cmExportFileGenerator,os,versionString);
  }
  poVar8 = std::operator<<(os,"# Load information for each installed configuration.\n");
  poVar8 = std::operator<<(poVar8,
                           "get_filename_component(_DIR \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n");
  poVar8 = std::operator<<(poVar8,"file(GLOB CONFIG_FILES \"${_DIR}/");
  GetConfigImportFileGlob_abi_cxx11_((string *)&e,this);
  poVar8 = std::operator<<(poVar8,(string *)&e);
  poVar8 = std::operator<<(poVar8,"\")\n");
  poVar8 = std::operator<<(poVar8,"foreach(f ${CONFIG_FILES})\n");
  poVar8 = std::operator<<(poVar8,"  include(${f})\n");
  poVar8 = std::operator<<(poVar8,"endforeach()\n");
  std::operator<<(poVar8,"\n");
  std::__cxx11::string::~string((string *)&e);
  poVar8 = std::operator<<(os,"# Cleanup temporary variables.\n");
  poVar8 = std::operator<<(poVar8,"set(_IMPORT_PREFIX)\n");
  std::operator<<(poVar8,"\n");
  cmExportFileGenerator::GenerateImportedFileCheckLoop(&this->super_cmExportFileGenerator,os);
  bVar11 = true;
  if (bVar3) {
    bVar11 = true;
    for (config = (this->super_cmExportFileGenerator).Configurations.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        config != (this->super_cmExportFileGenerator).Configurations.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; config = config + 1) {
      bVar3 = GenerateImportFileConfig(this,config,&missingTargets);
      bVar11 = (bool)(bVar11 & bVar3);
    }
  }
  cmExportFileGenerator::GenerateMissingTargetsCheckCode
            (&this->super_cmExportFileGenerator,os,&missingTargets);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&missingTargets);
  std::__cxx11::string::~string((string *)&installPrefix);
LAB_00457ad3:
  std::_Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::~_Vector_base
            (&allTargets.super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>);
  return bVar11;
}

Assistant:

bool cmExportInstallFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::vector<cmTargetExport*> allTargets;
  {
  std::string expectedTargets;
  std::string sep;
  for(std::vector<cmTargetExport*>::const_iterator
        tei = this->IEGen->GetExportSet()->GetTargetExports()->begin();
      tei != this->IEGen->GetExportSet()->GetTargetExports()->end(); ++tei)
    {
    expectedTargets += sep + this->Namespace + (*tei)->Target->GetExportName();
    sep = " ";
    cmTargetExport * te = *tei;
    if(this->ExportedTargets.insert(te->Target).second)
      {
      allTargets.push_back(te);
      }
    else
      {
      std::ostringstream e;
      e << "install(EXPORT \""
        << this->IEGen->GetExportSet()->GetName()
        << "\" ...) " << "includes target \"" << te->Target->GetName()
        << "\" more than once in the export set.";
      cmSystemTools::Error(e.str().c_str());
      return false;
      }
    }

  this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Set an _IMPORT_PREFIX variable for import location properties
  // to reference if they are relative to the install prefix.
  std::string installPrefix =
    this->IEGen->GetMakefile()->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
  std::string const& expDest = this->IEGen->GetDestination();
  if(cmSystemTools::FileIsFullPath(expDest))
    {
    // The export file is being installed to an absolute path so the
    // package is not relocatable.  Use the configured install prefix.
    os <<
      "# The installation prefix configured by this project.\n"
      "set(_IMPORT_PREFIX \"" << installPrefix << "\")\n"
      "\n";
    }
  else
    {
    // Add code to compute the installation prefix relative to the
    // import file location.
    std::string absDest = installPrefix + "/" + expDest;
    std::string absDestS = absDest + "/";
    os << "# Compute the installation prefix relative to this file.\n"
       << "get_filename_component(_IMPORT_PREFIX"
       << " \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n";
    if(cmHasLiteralPrefix(absDestS.c_str(), "/lib/") ||
       cmHasLiteralPrefix(absDestS.c_str(), "/lib64/") ||
       cmHasLiteralPrefix(absDestS.c_str(), "/usr/lib/") ||
       cmHasLiteralPrefix(absDestS.c_str(), "/usr/lib64/"))
      {
      // Handle "/usr move" symlinks created by some Linux distros.
      os <<
        "# Use original install prefix when loaded through a\n"
        "# cross-prefix symbolic link such as /lib -> /usr/lib.\n"
        "get_filename_component(_realCurr \"${_IMPORT_PREFIX}\" REALPATH)\n"
        "get_filename_component(_realOrig \"" << absDest << "\" REALPATH)\n"
        "if(_realCurr STREQUAL _realOrig)\n"
        "  set(_IMPORT_PREFIX \"" << absDest << "\")\n"
        "endif()\n"
        "unset(_realOrig)\n"
        "unset(_realCurr)\n";
      }
    std::string dest = expDest;
    while(!dest.empty())
      {
      os <<
        "get_filename_component(_IMPORT_PREFIX \"${_IMPORT_PREFIX}\" PATH)\n";
      dest = cmSystemTools::GetFilenamePath(dest);
      }
    os << "\n";
    }

  std::vector<std::string> missingTargets;

  bool require2_8_12 = false;
  bool require3_0_0 = false;
  bool require3_1_0 = false;
  bool requiresConfigFiles = false;
  // Create all the imported targets.
  for(std::vector<cmTargetExport*>::const_iterator
        tei = allTargets.begin();
      tei != allTargets.end(); ++tei)
    {
    cmTarget* te = (*tei)->Target;

    requiresConfigFiles = requiresConfigFiles
                              || te->GetType() != cmTarget::INTERFACE_LIBRARY;

    this->GenerateImportTargetCode(os, te);

    ImportPropertyMap properties;

    this->PopulateIncludeDirectoriesInterface(*tei,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateSourcesInterface(*tei,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",
                                  te,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS",
                                  te,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS",
                                  te,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS",
                                  te,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES",
                                  te,
                                  cmGeneratorExpression::InstallInterface,
                                  properties, missingTargets);

    const bool newCMP0022Behavior =
                              te->GetPolicyStatusCMP0022() != cmPolicies::WARN
                           && te->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior)
      {
      if (this->PopulateInterfaceLinkLibrariesProperty(te,
                                    cmGeneratorExpression::InstallInterface,
                                    properties, missingTargets)
          && !this->ExportOld)
        {
        require2_8_12 = true;
        }
      }
    if (te->GetType() == cmTarget::INTERFACE_LIBRARY)
      {
      require3_0_0 = true;
      }
    if(te->GetProperty("INTERFACE_SOURCES"))
      {
      // We can only generate INTERFACE_SOURCES in CMake 3.3, but CMake 3.1
      // can consume them.
      require3_1_0 = true;
      }

    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE",
                                  te, properties);
    this->PopulateCompatibleInterfaceProperties(te, properties);

    this->GenerateInterfaceProperties(te, os, properties);
    }

  if (require3_1_0)
    {
    this->GenerateRequiredCMakeVersion(os, "3.1.0");
    }
  else if (require3_0_0)
    {
    this->GenerateRequiredCMakeVersion(os, "3.0.0");
    }
  else if (require2_8_12)
    {
    this->GenerateRequiredCMakeVersion(os, "2.8.12");
    }

  // Now load per-configuration properties for them.
  os << "# Load information for each installed configuration.\n"
     << "get_filename_component(_DIR \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n"
     << "file(GLOB CONFIG_FILES \"${_DIR}/"
     << this->GetConfigImportFileGlob() << "\")\n"
     << "foreach(f ${CONFIG_FILES})\n"
     << "  include(${f})\n"
     << "endforeach()\n"
     << "\n";

  // Cleanup the import prefix variable.
  os << "# Cleanup temporary variables.\n"
     << "set(_IMPORT_PREFIX)\n"
     << "\n";
  this->GenerateImportedFileCheckLoop(os);

  bool result = true;
  // Generate an import file for each configuration.
  // Don't do this if we only export INTERFACE_LIBRARY targets.
  if (requiresConfigFiles)
    {
    for(std::vector<std::string>::const_iterator
          ci = this->Configurations.begin();
        ci != this->Configurations.end(); ++ci)
      {
      if(!this->GenerateImportFileConfig(*ci, missingTargets))
        {
        result = false;
        }
      }
    }

  this->GenerateMissingTargetsCheckCode(os, missingTargets);

  return result;
}